

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O3

SparseMatrix<double,_0,_int> * __thiscall
lf::assemble::COOMatrix<double>::makeSparse
          (SparseMatrix<double,_0,_int> *__return_storage_ptr__,COOMatrix<double> *this)

{
  runtime_error *this_00;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  pointer local_1a8 [2];
  ostream local_198 [376];
  
  (__return_storage_ptr__->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>).
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue = false;
  __return_storage_ptr__->m_outerSize = -1;
  __return_storage_ptr__->m_innerSize = 0;
  __return_storage_ptr__->m_outerIndex = (StorageIndex *)0x0;
  __return_storage_ptr__->m_innerNonZeros = (StorageIndex *)0x0;
  (__return_storage_ptr__->m_data).m_values = (Scalar *)0x0;
  (__return_storage_ptr__->m_data).m_indices = (StorageIndex *)0x0;
  (__return_storage_ptr__->m_data).m_size = 0;
  (__return_storage_ptr__->m_data).m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(__return_storage_ptr__,0,0);
  if (((ulong)this->rows_ != 0) && ((ulong)this->cols_ != 0)) {
    Eigen::SparseMatrix<double,_0,_int>::resize
              (__return_storage_ptr__,(ulong)this->rows_,(ulong)this->cols_);
    local_1a8[0] = (this->triplets_).
                   super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_1e8._M_dataplus._M_p =
         (pointer)(this->triplets_).
                  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    Eigen::internal::
    set_from_triplets<__gnu_cxx::__normal_iterator<Eigen::Triplet<double,int>const*,std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>>,Eigen::SparseMatrix<double,0,int>,Eigen::internal::scalar_sum_op<double,double>>
              (local_1a8,&local_1e8,__return_storage_ptr__,&local_208);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"matrix has zero rows or columns, this is probably an error.",0x3b);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"rows_ > 0 && cols_ > 0","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/coomatrix.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e8,&local_208,0xb0,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] Eigen::SparseMatrix<Scalar> makeSparse() const {
    Eigen::SparseMatrix<Scalar> result;
    LF_VERIFY_MSG(
        rows_ > 0 && cols_ > 0,
        "matrix has zero rows or columns, this is probably an error.");
    result.resize(rows_, cols_);
    result.setFromTriplets(triplets_.cbegin(), triplets_.cend());
    return result;
  }